

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void regularizer_to_weight<dense_parameters>(vw *param_1,bfgs *b,dense_parameters *weights)

{
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  float *pfVar5;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  long in_RSI;
  dense_iterator<float> *rhs;
  uint64_t i;
  iterator w;
  dense_parameters *in_stack_ffffffffffffffb0;
  dense_iterator<float> local_48;
  dense_iterator<float> local_30;
  dense_parameters *local_18;
  long local_10;
  
  local_18 = (dense_parameters *)CONCAT44(in_register_00000014,in_EDX);
  if (*(long *)(in_RSI + 0xd8) != 0) {
    local_10 = in_RSI;
    dense_parameters::begin(in_stack_ffffffffffffffb0);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffffb0);
      rhs = &local_48;
      bVar2 = dense_iterator<float>::operator!=(&local_30,rhs);
      if (!bVar2) break;
      pcVar4 = dense_iterator<float>::index(&local_30,(char *)rhs,__c);
      uVar3 = dense_parameters::stride_shift(local_18);
      in_stack_ffffffffffffffb0 = (dense_parameters *)((ulong)pcVar4 >> ((byte)uVar3 & 0x3f));
      fVar1 = *(float *)(*(long *)(local_10 + 0xd8) + (long)in_stack_ffffffffffffffb0 * 8);
      pfVar5 = dense_iterator<float>::operator*(&local_30);
      pfVar5[3] = fVar1;
      fVar1 = *(float *)(*(long *)(local_10 + 0xd8) + 4 + (long)in_stack_ffffffffffffffb0 * 8);
      pfVar5 = dense_iterator<float>::operator*(&local_30);
      *pfVar5 = fVar1;
      dense_iterator<float>::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void regularizer_to_weight(vw& /* all */, bfgs& b, T& weights)
{
  if (b.regularizers != nullptr)
  {
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      (&(*w))[W_COND] = b.regularizers[2 * i];
      *w = b.regularizers[2 * i + 1];
    }
  }
}